

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O0

int ON_UuidPtr::ComparePtrAndId(ON_UuidPtr *a,ON_UuidPtr *b)

{
  int local_24;
  int i;
  ON_UuidPtr *b_local;
  ON_UuidPtr *a_local;
  
  if (a == (ON_UuidPtr *)0x0) {
    a_local._4_4_ = 0;
    if (b != (ON_UuidPtr *)0x0) {
      a_local._4_4_ = -1;
    }
  }
  else if (b == (ON_UuidPtr *)0x0) {
    a_local._4_4_ = 1;
  }
  else {
    if (a->m_ptr < b->m_ptr) {
      local_24 = -1;
    }
    else if (b->m_ptr < a->m_ptr) {
      local_24 = 1;
    }
    else {
      local_24 = ON_UuidCompare(&a->m_id,&b->m_id);
    }
    a_local._4_4_ = local_24;
  }
  return a_local._4_4_;
}

Assistant:

int ON_UuidPtr::ComparePtrAndId( const ON_UuidPtr* a, const ON_UuidPtr* b )
{
  int i;
  if ( !a )
    return (b ? -1 : 0 );
  if ( !b )
    return 1;

  if (a->m_ptr < b->m_ptr)
    i = -1;
  else if (a->m_ptr > b->m_ptr)
    i = 1;
  else
    i = ON_UuidCompare(&a->m_id,&b->m_id);

  return i;
}